

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O1

_Bool adt_u32Set_remove(adt_u32Set_t *self,uint32_t val)

{
  uint uVar1;
  adt_u32List_elem_t *pElem;
  _Bool _Var2;
  
  if (self == (adt_u32Set_t *)0x0) {
    return false;
  }
  pElem = adt_u32List_iter_last(&self->list);
  if (pElem != (adt_u32List_elem_t *)0x0) {
    _Var2 = true;
    if (pElem->item == val) goto LAB_0010725e;
    if (pElem->item <= val) {
      _Var2 = false;
      goto LAB_0010725e;
    }
    pElem = adt_u32List_iter_first(&self->list);
    if (pElem != (adt_u32List_elem_t *)0x0) {
      do {
        uVar1 = pElem->item;
        if (val <= uVar1) goto LAB_00107246;
        pElem = adt_u32List_iter_next(pElem);
      } while (pElem != (adt_u32List_elem_t *)0x0);
      pElem = (adt_u32List_elem_t *)0x0;
LAB_00107246:
      _Var2 = uVar1 == val;
      goto LAB_0010725e;
    }
  }
  _Var2 = false;
  pElem = (adt_u32List_elem_t *)0x0;
LAB_0010725e:
  if (_Var2 != false) {
    adt_u32List_erase(&self->list,pElem);
  }
  return _Var2;
}

Assistant:

bool adt_u32Set_remove(adt_u32Set_t *self, uint32_t val)
{
   bool retval = false;
   if (self != 0)
   {
      adt_u32List_elem_t *iter = adt_u32List_iter_last(&self->list);
      if (iter != 0)
      {
         if ( val == iter->item )
         {
            retval = true;
         }
         else if (val < iter->item)
         {
            iter = adt_u32List_iter_first(&self->list);
            while (iter != 0)
            {
               if ( val == iter->item )
               {
                  retval = true;
                  break;
               }
               else if (val < iter->item)
               {
                  break;
               }
               iter = adt_u32List_iter_next(iter);
            }
         }
      }
      if (retval == true)
      {
         adt_u32List_erase(&self->list, iter);
      }
   }
   return retval;
}